

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.c
# Opt level: O2

void * encrypt_thread(void *pargs)

{
  long lVar1;
  uint uVar2;
  ulong ilen;
  size_t length;
  ulong local_8290;
  uint local_8288 [2];
  long local_8280;
  uint8_t iv [16];
  sha256_context ctx;
  aes_context aes;
  sha256_context tmp;
  uint8_t buffer [32816];
  
  iv._0_8_ = *(undefined8 *)((long)pargs + 0x28);
  iv._8_8_ = *(undefined8 *)((long)pargs + 0x30);
  aes_init(&aes,(uint8_t *)((long)pargs + 8),0x100);
  aes_ecb_encrypt(&aes,iv,iv);
  write_block(*(int *)((long)pargs + 4),iv,0x10);
  sha256_init(&ctx);
  sha256_starts(&ctx);
  local_8280 = 0x10;
  local_8288[0] = 0;
  local_8288[1] = 0;
  local_8290 = 0;
  do {
    lVar1 = local_8280;
    ilen = read_block(*pargs,buffer,0x8000);
    if ((long)ilen < 1) {
      if ((long)ilen < 0) {
        fwrite("Read error occured!\n",0x14,1,_stderr);
      }
      else {
        local_8280 = lVar1 + 0x10;
        aes_cbc_encrypt(&aes,iv,(uint8_t *)local_8288,0x10,(uint8_t *)local_8288);
        write_block(*(int *)((long)pargs + 4),local_8288,0x10);
      }
LAB_00102b4d:
      close(*(int *)((long)pargs + 4));
      close(*pargs);
      return (void *)0x0;
    }
    sha256_update(&ctx,buffer,ilen);
    sha256_copy(&tmp,&ctx);
    sha256_final(&tmp,buffer + ilen);
    if ((int)local_8290 != 0) {
      fwrite("an internal error has occured!\n",0x1f,1,_stderr);
      goto LAB_00102b4d;
    }
    length = ilen + 0x20;
    if ((ilen & 0xf) == 0) {
      local_8290 = 0;
    }
    else {
      uVar2 = 0x10 - (int)(ilen & 0xf);
      local_8290 = (ulong)uVar2;
      local_8288[0] = uVar2;
      length = length + local_8290;
    }
    aes_cbc_encrypt(&aes,iv,buffer,length,buffer);
    iv._0_8_ = *(undefined8 *)(buffer + (length - 0x10));
    iv._8_8_ = *(undefined8 *)(tmp.buffer + length + 0x38);
    write_block(*(int *)((long)pargs + 4),buffer,length);
    local_8280 = lVar1 + length;
  } while( true );
}

Assistant:

void *encrypt_thread(void *pargs) {
  args_t *args = (args_t *)pargs;
  sha256_context ctx, tmp;
  aes_context aes;
  uint8_t iv[AES_BLOCK_SIZE];
  uint8_t buffer[PSVIMG_BLOCK_SIZE + SHA256_BLOCK_SIZE + 0x10];
  ssize_t rd;
  union {
    struct {
      uint32_t padding;
      uint32_t unused;
      uint64_t total;
    } __attribute__((packed)) data;
    uint8_t raw[AES_BLOCK_SIZE];
  } footer;

  // write iv
  memcpy(iv, args->iv, AES_BLOCK_SIZE);
  aes_init(&aes, args->key, 256);
  aes_ecb_encrypt(&aes, iv, iv);
  write_block(args->out, iv, AES_BLOCK_SIZE);

  // encrypt blocks
  sha256_init(&ctx);
  sha256_starts(&ctx);
  footer.data.total = AES_BLOCK_SIZE; // from iv
  footer.data.padding = 0;
  footer.data.unused = 0;
  while ((rd = read_block(args->in, buffer, PSVIMG_BLOCK_SIZE)) > 0) {
    // generate hash
    sha256_update(&ctx, buffer, rd);
    sha256_copy(&tmp, &ctx);
    sha256_final(&tmp, &buffer[rd]);
    rd += SHA256_BLOCK_SIZE;

    // add padding
    if (footer.data.padding != 0) { // we should be reading 0x8000 blocks! only need padding once
      fprintf(stderr, "an internal error has occured!\n");
      goto end;
    }
    if (rd & (AES_BLOCK_SIZE-1)) {
      footer.data.padding = AES_BLOCK_SIZE - (rd & (AES_BLOCK_SIZE-1));
      rd += footer.data.padding;
    }

    // encrypt
    aes_cbc_encrypt(&aes, iv, buffer, rd, buffer);

    // save next iv
    memcpy(iv, &buffer[rd - AES_BLOCK_SIZE], AES_BLOCK_SIZE);

    // write output
    write_block(args->out, buffer, rd);

    footer.data.total += rd;
  }

  if (rd < 0) {
    fprintf(stderr, "Read error occured!\n");
    goto end;
  }

  // send footer
  footer.data.total += 0x10;
  footer.data.padding = htole32(footer.data.padding);
  footer.data.total = htole64(footer.data.total);
  aes_cbc_encrypt(&aes, iv, footer.raw, AES_BLOCK_SIZE, footer.raw);
  write_block(args->out, footer.raw, AES_BLOCK_SIZE);

end:
  close(args->out);
  close(args->in);
  return NULL;
}